

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

mbedtls_ecp_group_id * mbedtls_ecp_grp_id_list(void)

{
  if (mbedtls_ecp_grp_id_list_init_done == '\0') {
    ecp_supported_grp_id[0] = MBEDTLS_ECP_DP_SECP256R1;
    ecp_supported_grp_id[1] = MBEDTLS_ECP_DP_NONE;
    mbedtls_ecp_grp_id_list_init_done = '\x01';
  }
  return ecp_supported_grp_id;
}

Assistant:

const mbedtls_ecp_group_id *mbedtls_ecp_grp_id_list(void)
{
    static int init_done = 0;

    if (!init_done) {
        size_t i = 0;
        const mbedtls_ecp_curve_info *curve_info;

        for (curve_info = mbedtls_ecp_curve_list();
             curve_info->grp_id != MBEDTLS_ECP_DP_NONE;
             curve_info++) {
            ecp_supported_grp_id[i++] = curve_info->grp_id;
        }
        ecp_supported_grp_id[i] = MBEDTLS_ECP_DP_NONE;

        init_done = 1;
    }

    return ecp_supported_grp_id;
}